

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_compress_double_precision
               (uint32_t *nr_of_compressed_bytes,uint8_t **out,double *input,
               uint32_t number_of_doubles,uint64_t hash1_size_exponent,uint64_t hash2_size_exponent)

{
  byte *pbVar1;
  double value_00;
  uint8_t *puVar2;
  size_t num;
  size_t num_00;
  void *ptr;
  void *ptr_00;
  uint local_f0;
  uint32_t i;
  uint8_t hash_info;
  uint8_t *p_out;
  uint32_t j;
  uint64_t bcode [2];
  uint64_t xor2 [2];
  uint64_t xor1 [2];
  uint64_t prediction2;
  uint64_t prediction1;
  uint64_t hash2;
  uint64_t hash1;
  uint64_t last_value;
  uint64_t stride;
  uint64_t value;
  uint64_t *hash_table_2;
  uint64_t *hash_table_1;
  uint64_t hash2_mask;
  uint64_t hash1_mask;
  uint64_t hash2_size;
  uint64_t hash1_size;
  ulong uStack_38;
  uint32_t max_size;
  uint64_t hash2_size_exponent_local;
  uint64_t hash1_size_exponent_local;
  double *pdStack_20;
  uint32_t number_of_doubles_local;
  double *input_local;
  uint8_t **out_local;
  uint32_t *nr_of_compressed_bytes_local;
  
  hash2_size_exponent_local = hash1_size_exponent & 0xfffffffffffffffe;
  uStack_38 = hash2_size_exponent & 0xfffffffffffffffe;
  if (0x1e < hash2_size_exponent_local) {
    hash2_size_exponent_local = 0x1e;
  }
  if (0x1e < uStack_38) {
    uStack_38 = 0x1e;
  }
  puVar2 = (uint8_t *)
           trico_malloc((ulong)(number_of_doubles * 8 + (number_of_doubles >> 1) +
                               (number_of_doubles & 1)));
  *out = puVar2;
  num = 1L << ((byte)hash2_size_exponent_local & 0x3f);
  num_00 = 1L << ((byte)uStack_38 & 0x3f);
  ptr = trico_calloc(num,8);
  ptr_00 = trico_calloc(num_00,8);
  hash1 = 0;
  hash2 = 0;
  prediction1 = 0;
  prediction2 = 0;
  xor1[1] = 0;
  p_out._4_4_ = 0;
  pbVar1 = *out;
  *pbVar1 = (byte)((hash2_size_exponent_local >> 1) << 4) | (byte)(uStack_38 >> 1);
  pbVar1[1] = (byte)(number_of_doubles >> 0x18);
  pbVar1[2] = (byte)(number_of_doubles >> 0x10);
  pbVar1[3] = (byte)(number_of_doubles >> 8);
  _i = pbVar1 + 5;
  pbVar1[4] = (byte)number_of_doubles;
  pdStack_20 = input;
  for (local_f0 = 0; local_f0 < number_of_doubles; local_f0 = local_f0 + 1) {
    p_out._4_4_ = local_f0 & 1;
    value_00 = *pdStack_20;
    xor2[(ulong)p_out._4_4_ + 1] = (ulong)value_00 ^ prediction2;
    *(double *)((long)ptr + hash2 * 8) = value_00;
    hash2 = trico_compute_hash1_64(hash2,(uint64_t)value_00,hash2_size_exponent_local,num - 1);
    prediction2 = *(uint64_t *)((long)ptr + hash2 * 8);
    bcode[(ulong)p_out._4_4_ + 1] = (ulong)value_00 ^ hash1 + xor1[1];
    *(uint64_t *)((long)ptr_00 + prediction1 * 8) = (long)value_00 - hash1;
    prediction1 = trico_compute_hash2_64(prediction1,(long)value_00 - hash1,uStack_38,num_00 - 1);
    xor1[1] = *(uint64_t *)((long)ptr_00 + prediction1 * 8);
    *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 8;
    if (xor2[(ulong)p_out._4_4_ + 1] == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0;
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 1;
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 2;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 3;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x20 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 4;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xb;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x28 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 5;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xb;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x20 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xc;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x30 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 6;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xb;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x20 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xc;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x28 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xd;
      }
    }
    else if (xor2[(ulong)p_out._4_4_ + 1] >> 0x38 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 7;
      if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xb;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x20 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xc;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x28 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xd;
      }
      else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x30 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xe;
      }
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 8 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 9;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x10 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 10;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x18 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xb;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x20 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xc;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x28 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xd;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x30 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xe;
    }
    else if (bcode[(ulong)p_out._4_4_ + 1] >> 0x38 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff28 + (ulong)p_out._4_4_ * 8) = 0xf;
    }
    if (p_out._4_4_ == 1) {
      trico_fill_code_double((uint8_t **)&i,xor2 + 1,bcode + 1,(uint64_t *)&stack0xffffffffffffff28)
      ;
    }
    hash1 = (uint64_t)value_00;
    pdStack_20 = pdStack_20 + 1;
  }
  if (p_out._4_4_ == 0) {
    bcode[0] = 1;
    trico_fill_code_double((uint8_t **)&i,xor2 + 1,bcode + 1,(uint64_t *)&stack0xffffffffffffff28);
  }
  *nr_of_compressed_bytes = (int)_i - (int)*out;
  trico_free(ptr);
  trico_free(ptr_00);
  puVar2 = (uint8_t *)trico_realloc(*out,(ulong)*nr_of_compressed_bytes);
  *out = puVar2;
  return;
}

Assistant:

void trico_compress_double_precision(uint32_t* nr_of_compressed_bytes, uint8_t** out, const double* input, const uint32_t number_of_doubles, uint64_t hash1_size_exponent, uint64_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_doubles) * sizeof(double) + (number_of_doubles) / 2 + (number_of_doubles & 1); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  uint64_t value;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t hash1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction1 = 0;
  uint64_t prediction2 = 0;
  uint64_t xor1[2];
  uint64_t xor2[2];
  uint64_t bcode[2];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_doubles >> 24));
  *p_out++ = (uint8_t)((number_of_doubles >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles) & 0xff);

  for (uint32_t i = 0; i < number_of_doubles; ++i)
    {
    j = i & 1;
    value = *(const uint64_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 8; // 8 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      }
    else if (0 == (xor1[j] >> 32))
      {
      bcode[j] = 4; // 4 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      }
    else if (0 == (xor1[j] >> 40))
      {
      bcode[j] = 5; // 5 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      }
    else if (0 == (xor1[j] >> 48))
      {
      bcode[j] = 6; // 6 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      }
    else if (0 == (xor1[j] >> 56))
      {
      bcode[j] = 7; // 7 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      }
    else // 8 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      else if (0 == (xor2[j] >> 56))
        {
        bcode[j] = 15; // 7 bytes
        }
      }

    if (j == 1)
      {
      trico_fill_code_double(&p_out, xor1, xor2, bcode);
      }
    }
  if (j == 0)
    {
    bcode[1] = 1;
    xor1[1] = 0;
    trico_fill_code_double(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }